

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9WriteVer(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *pFileName;
  int iVar1;
  Io_FileType_t FileType;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  uint fVerbose;
  
  pcVar2 = (char *)0x0;
  Extra_UtilGetoptReset();
  fVerbose = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Svh"), iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) {
      if (argc - globalUtilOptind == 1) {
        if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
          pcVar2 = "There is no mapped file to write.\n";
        }
        else if (pcVar2 == (char *)0x0) {
          pcVar2 = "The specification file is not given.\n";
        }
        else {
          pFileName = argv[globalUtilOptind];
          FileType = Io_ReadFileType(pcVar2);
          pNtk = Io_ReadNetlist(pcVar2,FileType,0);
          if (pNtk != (Abc_Ntk_t *)0x0) {
            Abc_NtkInsertHierarchyGia(pNtk,pAbc->pNtkCur,fVerbose);
            Io_WriteVerilog(pNtk,pFileName);
            Abc_NtkDelete(pNtk);
            return 0;
          }
          pcVar2 = "Reading hierarchical Verilog for the specification has failed.\n";
        }
      }
      else {
        pcVar2 = "Expecting output file name on the command line.\n";
      }
      iVar1 = -1;
      goto LAB_00227589;
    }
    if (iVar1 != 0x53) goto LAB_0022750a;
    if (argc <= globalUtilOptind) break;
    pcVar2 = argv[globalUtilOptind];
    globalUtilOptind = globalUtilOptind + 1;
  }
  Abc_Print(-1,"Command line switch \"-S\" should be followed by a file name.\n");
LAB_0022750a:
  Abc_Print(-2,"usage: &write_ver [-S <file>] [-vh] <file>\n");
  Abc_Print(-2,"\t          writes hierarchical Verilog after mapping\n");
  Abc_Print(-2,"\t-S file : file name for the original hierarchical design (required)\n");
  pcVar2 = "yes";
  if (fVerbose == 0) {
    pcVar2 = "no";
  }
  Abc_Print(-2,"\t-v      : toggle verbose output [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h      : print the command usage\n");
  pcVar2 = "\t<file>  : the file name\n";
  iVar1 = -2;
LAB_00227589:
  Abc_Print(iVar1,pcVar2);
  return 1;
}

Assistant:

int Abc_CommandAbc9WriteVer( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileSpec = NULL;
    Abc_Ntk_t * pNtkSpec = NULL;
    char * pFileName;
    char ** pArgvNew;
    int c, nArgcNew;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Svh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a file name.\n" );
                goto usage;
            }
            pFileSpec = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "Expecting output file name on the command line.\n" );
        return 1;
    }
    pFileName = argv[globalUtilOptind];
    if ( pAbc->pNtkCur == NULL )
    {
        Abc_Print( -1, "There is no mapped file to write.\n" );
        return 1;
    }
    if ( pFileSpec == NULL )
    {
        Abc_Print( -1, "The specification file is not given.\n" );
        return 1;
    }
    pNtkSpec = Io_ReadNetlist( pFileSpec, Io_ReadFileType(pFileSpec), 0 );
    if ( pNtkSpec == NULL )
    {
        Abc_Print( -1, "Reading hierarchical Verilog for the specification has failed.\n" );
        return 1;
    }
    Abc_NtkInsertHierarchyGia( pNtkSpec, pAbc->pNtkCur, fVerbose );
    Io_WriteVerilog( pNtkSpec, pFileName );
    Abc_NtkDelete( pNtkSpec );
    return 0;

usage:
    Abc_Print( -2, "usage: &write_ver [-S <file>] [-vh] <file>\n" );
    Abc_Print( -2, "\t          writes hierarchical Verilog after mapping\n" );
    Abc_Print( -2, "\t-S file : file name for the original hierarchical design (required)\n" );
    Abc_Print( -2, "\t-v      : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    Abc_Print( -2, "\t<file>  : the file name\n");
    return 1;
}